

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::GLSL420Pack::InitializerListTest::getArrayDefinition_abi_cxx11_
          (string *__return_storage_ptr__,InitializerListTest *this)

{
  TESTED_INITIALIZERS TVar1;
  reference pvVar2;
  TestError *this_00;
  testCase *test_case;
  InitializerListTest *this_local;
  string *array_definition;
  
  pvVar2 = std::
           vector<gl4cts::GLSL420Pack::InitializerListTest::testCase,_std::allocator<gl4cts::GLSL420Pack::InitializerListTest::testCase>_>
           ::operator[](&this->m_test_cases,(long)this->m_current_test_case_index);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  TVar1 = pvVar2->m_initializer;
  if (STRUCT < TVar1) {
    if (TVar1 - ARRAY_SCALAR < 6) {
LAB_010aecfc:
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,"[4]");
      return __return_storage_ptr__;
    }
    if (3 < TVar1 - NESTED_STRUCT_CTR) {
      if (TVar1 - NESTED_ARRAY_STRUCT_STRUCT_LIST < 2) goto LAB_010aecfc;
      if (1 < TVar1 - NESTED_STRUCT_STRUCT_ARRAY_LIST) {
        if (TVar1 - UNSIZED_ARRAY_SCALAR < 4) {
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,"[]");
          return __return_storage_ptr__;
        }
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Invalid enum",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                   ,0x35a3);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
    }
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string InitializerListTest::getArrayDefinition()
{
	const testCase& test_case = m_test_cases[m_current_test_case_index];

	std::string array_definition;

	switch (test_case.m_initializer)
	{
	case VECTOR:
	case MATRIX:
	case MATRIX_ROWS:
	case STRUCT:
	case NESTED_STRUCT_CTR:
	case NESTED_STRUCT_LIST:
	case NESTED_STURCT_ARRAYS_STRUCT_LIST:
	case NESTED_STURCT_ARRAYS_STRUCT_MIX:
	case NESTED_STRUCT_STRUCT_ARRAY_LIST:
	case NESTED_STRUCT_STRUCT_ARRAY_MIX:
		array_definition = "";
		break;
	case ARRAY_SCALAR:
	case ARRAY_VECTOR_CTR:
	case ARRAY_VECTOR_LIST:
	case ARRAY_MATRIX_CTR:
	case ARRAY_MATRIX_LIST:
	case ARRAY_STRUCT:
	case NESTED_ARRAY_STRUCT_STRUCT_LIST:
	case NESTED_ARRAY_STRUCT_STRUCT_MIX:
		array_definition = "[4]";
		break;
	case UNSIZED_ARRAY_SCALAR:
	case UNSIZED_ARRAY_VECTOR:
	case UNSIZED_ARRAY_MATRIX:
	case UNSIZED_ARRAY_STRUCT:
		array_definition = "[]";
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	return array_definition;
}